

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tape.cpp
# Opt level: O2

void __thiscall InfiniteTape::InfiniteTape(InfiniteTape *this,int64_t opt)

{
  list<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  *this_00;
  tuple<Cell_*,_std::default_delete<Cell>_> in_RAX;
  pointer *__ptr;
  __uniq_ptr_impl<Cell,_std::default_delete<Cell>_> local_18;
  
  local_18._M_t.super__Tuple_impl<0UL,_Cell_*,_std::default_delete<Cell>_>.
  super__Head_base<0UL,_Cell_*,_false>._M_head_impl =
       (tuple<Cell_*,_std::default_delete<Cell>_>)
       (tuple<Cell_*,_std::default_delete<Cell>_>)
       in_RAX.super__Tuple_impl<0UL,_Cell_*,_std::default_delete<Cell>_>.
       super__Head_base<0UL,_Cell_*,_false>._M_head_impl;
  BasicTape::BasicTape(&this->super_BasicTape,opt);
  (this->super_BasicTape)._vptr_BasicTape = (_func_int **)&PTR__InfiniteTape_001239b0;
  this_00 = &this->tape;
  (this->tape).
  super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->tape).
  super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->tape).
  super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->it)._M_node = (_List_node_base *)0x0;
  CellGenerator::operator()((CellGenerator *)&local_18);
  std::__cxx11::
  list<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ::push_back(this_00,(value_type *)&local_18);
  if (local_18._M_t.super__Tuple_impl<0UL,_Cell_*,_std::default_delete<Cell>_>.
      super__Head_base<0UL,_Cell_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_Cell_*,_std::default_delete<Cell>_>)0x0) {
    (**(code **)(*(long *)local_18._M_t.super__Tuple_impl<0UL,_Cell_*,_std::default_delete<Cell>_>.
                          super__Head_base<0UL,_Cell_*,_false>._M_head_impl + 8))();
  }
  (this->it)._M_node =
       (this->tape).
       super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  return;
}

Assistant:

InfiniteTape::InfiniteTape(int64_t opt) : BasicTape { opt } {
    tape.push_back(generator());
    it = tape.begin();
}